

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_move_32_pd_a(void)

{
  uint address;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  uVar1 = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  uVar3 = (ulong)(m68ki_cpu.ir >> 7 & 0x1c);
  iVar2 = *(int *)((long)m68ki_cpu.dar + uVar3 + 0x20);
  address = iVar2 - 4;
  *(uint *)((long)m68ki_cpu.dar + uVar3 + 0x20) = address;
  m68ki_write_16_fc(iVar2 - 2,m68ki_cpu.s_flag | 1,uVar1 & 0xffff);
  m68ki_write_16_fc(address,m68ki_cpu.s_flag | 1,uVar1 >> 0x10);
  m68ki_cpu.n_flag = uVar1 >> 0x18;
  m68ki_cpu.not_z_flag = uVar1;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_move_32_pd_a(void)
{
	uint res = AY;
	uint ea = EA_AX_PD_32();

	m68ki_write_16(ea+2, res & 0xFFFF );
	m68ki_write_16(ea, (res >> 16) & 0xFFFF );

	FLAG_N = NFLAG_32(res);
	FLAG_Z = res;
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = CFLAG_CLEAR;
}